

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

int __thiscall
ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,ON_3dPoint *B,double *pivot)

{
  double **ppdVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double ***pppdVar6;
  double *pdVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int row0;
  ulong uVar13;
  ON_3dPoint *pOVar14;
  ON_3dPoint *this_00;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  ulong local_e0;
  double local_d8;
  ON_3dPoint t;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  uVar9 = this->m_row_count;
  pppdVar6 = &this->m;
  if (uVar9 == (this->m_rowmem).m_count) {
    pppdVar6 = &(this->m_rowmem).m_a;
  }
  ppdVar1 = *pppdVar6;
  uVar2 = this->m_col_count;
  if ((int)uVar9 < this->m_col_count) {
    uVar2 = uVar9;
  }
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar11 = 0;
  }
  pOVar14 = B + 1;
  uVar15 = 0;
  uVar17 = 0;
  uVar12 = 1;
  uVar10 = 0;
  while (local_e0 = uVar11, uVar10 != uVar11) {
    uVar13 = uVar10 & 0xffffffff;
    onmalloc(0);
    pdVar7 = ppdVar1[uVar10];
    dVar19 = pdVar7[uVar10];
    uVar16 = SUB84(dVar19,0);
    uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
    dVar19 = ABS(dVar19);
    local_e0 = uVar10 & 0xffffffff;
    for (uVar8 = uVar12; (int)uVar8 < this->m_row_count; uVar8 = uVar8 + 1) {
      if (dVar19 < ABS(ppdVar1[uVar8][uVar10])) {
        uVar13 = uVar8 & 0xffffffff;
        dVar19 = ABS(ppdVar1[uVar8][uVar10]);
      }
    }
    local_d8 = dVar19;
    if ((uVar10 != 0) && ((double)CONCAT44(uVar17,uVar15) <= dVar19)) {
      local_d8 = (double)CONCAT44(uVar17,uVar15);
    }
    uVar15 = SUB84(local_d8,0);
    uVar17 = (undefined4)((ulong)local_d8 >> 0x20);
    if (dVar19 <= zero_tolerance) break;
    row0 = (int)uVar13;
    if (uVar10 != uVar13) {
      SwapRows(this,row0,(uint)uVar10);
      dVar19 = B[row0].z;
      dVar3 = B[row0].x;
      dVar4 = B[row0].y;
      B[row0].z = B[uVar10].z;
      dVar5 = B[uVar10].y;
      B[row0].x = B[uVar10].x;
      B[row0].y = dVar5;
      B[uVar10].z = dVar19;
      B[uVar10].x = dVar3;
      B[uVar10].y = dVar4;
      pdVar7 = ppdVar1[uVar10];
      uVar16 = SUB84(pdVar7[uVar10],0);
      uVar18 = (undefined4)((ulong)pdVar7[uVar10] >> 0x20);
    }
    dVar19 = 1.0 / (double)CONCAT44(uVar18,uVar16);
    uVar13 = uVar10 + 1;
    pdVar7[uVar10] = 1.0;
    uVar9 = ~(uint)uVar10;
    ON_ArrayScale(this->m_col_count + uVar9,dVar19,pdVar7 + uVar13,pdVar7 + uVar13);
    ON_3dPoint::operator*=(B + uVar10,dVar19);
    this_00 = pOVar14;
    for (uVar8 = uVar12; (int)uVar8 < this->m_row_count; uVar8 = uVar8 + 1) {
      pdVar7 = ppdVar1[uVar8];
      dVar19 = pdVar7[uVar10];
      pdVar7[uVar10] = 0.0;
      if (zero_tolerance < ABS(dVar19)) {
        dVar19 = (double)((ulong)dVar19 ^ (ulong)DAT_006924b0);
        ON_Array_aA_plus_B(this->m_col_count + uVar9,dVar19,ppdVar1[uVar10] + uVar13,pdVar7 + uVar13
                           ,pdVar7 + uVar13);
        ::operator*(&local_60,dVar19,B + uVar10);
        ON_3dVector::ON_3dVector(&local_48,&local_60);
        ON_3dPoint::operator+=(this_00,&local_48);
      }
      this_00 = this_00 + 1;
    }
    uVar12 = uVar12 + 1;
    pOVar14 = pOVar14 + 1;
    uVar10 = uVar13;
  }
  if (pivot != (double *)0x0) {
    *pivot = (double)CONCAT44(uVar17,uVar15);
  }
  return (int)local_e0;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    ON_3dPoint* B,
    double* pivot 
    )
{
  ON_3dPoint t;
  double x, piv;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    //onfree( onmalloc( 1)); // 8-06-03 lw for cancel thread responsiveness
    onmalloc( 0); // 9-4-03 lw changed to 0
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    if ( ix != k )
    {
      // swap rows of matrix and B
      SwapRows( ix, k );
      t = B[ix]; B[ix] = B[k]; B[k] = t;
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
    B[k] *= x;

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        B[i] += x*B[k];
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  return rank;
}